

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

float NormedCustomLoss2(vector<INeuron_*,_std::allocator<INeuron_*>_> *outputNeurons,Target classId,
                       vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  INeuron *this;
  pointer pfVar2;
  int iVar3;
  int neuronId_1;
  long lVar4;
  ulong uVar5;
  int neuronId;
  pointer ppIVar6;
  ulong uVar7;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_4c;
  undefined1 local_48 [16];
  
  ppIVar1 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = 0;
  for (ppIVar6 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppIVar6 != ppIVar1; ppIVar6 = ppIVar6 + 1) {
    this = *ppIVar6;
    iVar3 = INeuron::GetOutputSpikeCounter(this);
    if (uVar5 < (ulong)(long)iVar3) {
      iVar3 = INeuron::GetOutputSpikeCounter(this);
      uVar5 = (ulong)iVar3;
    }
  }
  fVar9 = 0.0;
  for (uVar7 = 0;
      ppIVar6 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(outputNeurons->
                            super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppIVar6 >> 3);
      uVar7 = uVar7 + 1) {
    uVar8 = -(uint)(ABS(classId - (float)(int)uVar7) < 1e-05);
    if (uVar5 == 0) {
      local_4c = 0.0;
    }
    else {
      local_48 = ZEXT416(uVar8);
      iVar3 = INeuron::GetOutputSpikeCounter(ppIVar6[uVar7]);
      local_4c = (float)iVar3 / (float)uVar5;
      uVar8 = local_48._0_4_;
    }
    local_4c = local_4c - (float)(uVar8 & 0x3f800000);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(deltas,&local_4c);
    fVar11 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1];
    fVar9 = fVar9 + fVar11 * fVar11;
  }
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar11 = 0.0;
  if (1e-05 < fVar9) {
    ppIVar6 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    ppIVar1 = (outputNeurons->super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pfVar2 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar4 = 0; (long)ppIVar6 - (long)ppIVar1 >> 3 != lVar4; lVar4 = lVar4 + 1) {
      fVar10 = pfVar2[lVar4] / fVar9;
      pfVar2[lVar4] = fVar10;
      fVar11 = fVar10 * fVar10 * 0.5 + fVar11;
    }
  }
  return -fVar11;
}

Assistant:

float
NormedCustomLoss2( const std::vector<INeuron *> &outputNeurons, SPIKING_NN::Target classId, std::vector<float> &deltas )
{
    float loss = 0;
    size_t maxSpikes = 0;
    float s = 0;
    for ( auto neuron: outputNeurons ) {
        if ( neuron->GetOutputSpikeCounter() > maxSpikes ) {
            maxSpikes = neuron->GetOutputSpikeCounter();
        }
    }
    for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
        INeuron *neuron = outputNeurons[neuronId];
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        float output = maxSpikes ? static_cast<float>(neuron->GetOutputSpikeCounter()) / maxSpikes : 0;
        deltas.emplace_back( output - target );
        s += deltas.back() * deltas.back();
    }
    s = sqrt( s );
    if ( s > SPIKING_NN::EPS ) {
        for ( int neuronId = 0; neuronId < outputNeurons.size(); neuronId++ ) {
            deltas[neuronId] = deltas[neuronId] / s;
            loss += 0.5 * ( deltas[neuronId] * deltas[neuronId] );
        }
    }
    return -loss;
}